

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  cmState *this_00;
  int iVar1;
  char *pcVar2;
  string fullPath;
  stat st;
  string local_e8;
  string local_c8;
  stat64 local_a8;
  
  pcVar2 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)&local_e8,pcVar2,(allocator *)&local_a8);
  std::__cxx11::string::append((char *)&local_e8);
  std::__cxx11::string::append((char *)&local_e8);
  iVar1 = stat64(local_e8._M_dataplus._M_p,&local_a8);
  if (iVar1 == 0) {
    this_00 = this->State;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CACHEFILE_DIR","");
    pcVar2 = cmState::GetInitializedCacheValue(this_00,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar2 == (char *)0x0) {
      cmsys::SystemTools::RemoveFile(&local_e8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = this->GetHomeOutputDirectory();
  fullPath += "/";
  fullPath += fname;
  struct stat st;
  if ( ::stat(fullPath.c_str(), &st) )
    {
    return;
    }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR"))
    {
    cmSystemTools::RemoveFile(fullPath);
    return;
    }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if ( fsize < maxFileSize )
    {
    //TODO: truncate file
    return;
    }
}